

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint If_DsdObjHashKey(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint local_30;
  uint local_2c;
  uint uHash;
  int i;
  int truthId_local;
  int nLits_local;
  int *pLits_local;
  int Type_local;
  If_DsdMan_t *p_local;
  
  local_30 = Type * 0x1ec1 + nLits * 0x1fd3;
  for (local_2c = 0; (int)local_2c < nLits; local_2c = local_2c + 1) {
    local_30 = pLits[(int)local_2c] * If_DsdObjHashKey::s_Primes[(int)(local_2c & 0xf)] + local_30;
  }
  if (Type == 6) {
    local_30 = truthId * If_DsdObjHashKey::s_Primes[(int)(local_2c & 0xf)] + local_30;
  }
  return local_30 % (uint)p->nBins;
}

Assistant:

static inline unsigned If_DsdObjHashKey( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    static int s_Primes[24] = { 1049, 1297, 1559, 1823, 2089, 2371, 2663, 2909, 
                                3221, 3517, 3779, 4073, 4363, 4663, 4973, 5281, 
                                5573, 5861, 6199, 6481, 6803, 7109, 7477, 7727 };
    int i;
    unsigned uHash = Type * 7873 + nLits * 8147;
    for ( i = 0; i < nLits; i++ )
        uHash += pLits[i] * s_Primes[i & 0xF];
    if ( Type == IF_DSD_PRIME )
        uHash += truthId * s_Primes[i & 0xF];
    return uHash % p->nBins;
}